

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

uint __thiscall cppcms::http::request::server_port(request *this)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *local_40 [2];
  char local_30 [16];
  
  pcVar2 = cppcms::impl::string_map::get(&this->conn_->env_,"SERVER_PORT");
  pcVar4 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar4 = pcVar2;
  }
  local_40[0] = local_30;
  sVar3 = strlen(pcVar4);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,pcVar4,pcVar4 + sVar3);
  pcVar4 = local_40[0];
  uVar1 = atoi(local_40[0]);
  if (pcVar4 != local_30) {
    operator_delete(pcVar4);
  }
  return uVar1;
}

Assistant:

unsigned request::server_port() { return atoi(conn_->getenv("SERVER_PORT").c_str()); }